

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_bfins_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 arg1;
  uint16_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 ret_02;
  uint32_t maski_1;
  TCGv_i32 rot;
  TCGv_i32 mask;
  uint32_t roti;
  uint32_t maski;
  TCGv_i32 tmp;
  int pos;
  int ofs;
  int len;
  TCGv_i32 src;
  TCGv_i32 dst;
  int ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  uVar5 = (uint)uVar1;
  ret = tcg_ctx_00->cpu_dregs[(int)(insn & 7)];
  arg1 = tcg_ctx_00->cpu_dregs[(int)((int)uVar5 >> 0xc & 7)];
  uVar2 = extract32(uVar5,0,5);
  uVar3 = (uVar2 - 1 & 0x1f) + 1;
  uVar2 = extract32(uVar5,6,5);
  uVar4 = (0x20 - uVar2) - uVar3;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  if ((uVar1 & 0x20) == 0) {
    tcg_gen_shli_i32_m68k(tcg_ctx_00,QREG_CC_N,arg1,0x20 - uVar3);
  }
  else {
    tcg_gen_neg_i32(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_dregs[(int)(uVar5 & 7)]);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_00,ret_00,0x1f);
    tcg_gen_shl_i32(tcg_ctx_00,QREG_CC_N,arg1,ret_00);
  }
  set_cc_op(s,CC_OP_LOGIC);
  if ((uVar1 & 0x820) == 0) {
    if ((int)uVar4 < 0) {
      uVar5 = -2 << ((char)uVar3 - 1U & 0x1f);
      uVar3 = uVar2 + uVar3 & 0x1f;
      tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_00,arg1,uVar5 ^ 0xffffffff);
      tcg_gen_rotri_i32_m68k(tcg_ctx_00,ret_00,ret_00,uVar3);
      uVar2 = ror32(uVar5,uVar3);
      tcg_gen_andi_i32_m68k(tcg_ctx_00,ret,ret,uVar2);
      tcg_gen_or_i32(tcg_ctx_00,ret,ret,ret_00);
    }
    else {
      tcg_gen_deposit_i32_m68k(tcg_ctx_00,ret,ret,arg1,uVar4,uVar3);
    }
  }
  else {
    ret_01 = tcg_temp_new_i32(tcg_ctx_00);
    ret_02 = tcg_temp_new_i32(tcg_ctx_00);
    if ((uVar1 & 0x20) == 0) {
      uVar4 = -2 << ((char)uVar3 - 1U & 0x1f);
      tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_00,arg1,uVar4 ^ 0xffffffff);
      tcg_gen_movi_i32(tcg_ctx_00,ret_01,uVar4);
      tcg_gen_movi_i32(tcg_ctx_00,ret_02,uVar3 & 0x1f);
    }
    else {
      tcg_gen_subi_i32_m68k(tcg_ctx_00,ret_02,tcg_ctx_00->cpu_dregs[(int)(uVar5 & 7)],1);
      tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_02,ret_02,0x1f);
      tcg_gen_movi_i32(tcg_ctx_00,ret_01,-2);
      tcg_gen_shl_i32(tcg_ctx_00,ret_01,ret_01,ret_02);
      tcg_gen_mov_i32(tcg_ctx_00,ret_02,tcg_ctx_00->cpu_dregs[(int)(uVar5 & 7)]);
      tcg_gen_andc_i32_m68k(tcg_ctx_00,ret_00,arg1,ret_01);
    }
    if ((uVar1 & 0x800) == 0) {
      tcg_gen_addi_i32_m68k(tcg_ctx_00,ret_02,ret_02,uVar2);
    }
    else {
      tcg_gen_add_i32(tcg_ctx_00,ret_02,ret_02,tcg_ctx_00->cpu_dregs[(int)((int)uVar5 >> 6 & 7)]);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx_00,ret_02,ret_02,0x1f);
    tcg_gen_rotr_i32_m68k(tcg_ctx_00,ret_01,ret_01,ret_02);
    tcg_gen_rotr_i32_m68k(tcg_ctx_00,ret_00,ret_00,ret_02);
    tcg_gen_and_i32(tcg_ctx_00,ret,ret,ret_01);
    tcg_gen_or_i32(tcg_ctx_00,ret,ret,ret_00);
    tcg_temp_free_i32(tcg_ctx_00,ret_02);
    tcg_temp_free_i32(tcg_ctx_00,ret_01);
  }
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  return;
}

Assistant:

DISAS_INSN(bfins_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv dst = DREG(insn, 0);
    TCGv src = DREG(ext, 12);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    int pos = 32 - ofs - len;        /* little bit-endian */
    TCGv tmp;

    tmp = tcg_temp_new(tcg_ctx);

    if (ext & 0x20) {
        /* Variable width */
        tcg_gen_neg_i32(tcg_ctx, tmp, DREG(ext, 0));
        tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 31);
        tcg_gen_shl_i32(tcg_ctx, QREG_CC_N, src, tmp);
    } else {
        /* Immediate width */
        tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, 32 - len);
    }
    set_cc_op(s, CC_OP_LOGIC);

    /* Immediate width and offset */
    if ((ext & 0x820) == 0) {
        /* Check for suitability for deposit.  */
        if (pos >= 0) {
            tcg_gen_deposit_i32(tcg_ctx, dst, dst, src, pos, len);
        } else {
#ifdef _MSC_VER
            uint32_t maski = 0xfffffffeU << (len - 1);
#else
            uint32_t maski = -2U << (len - 1);
#endif
            uint32_t roti = (ofs + len) & 31;
            tcg_gen_andi_i32(tcg_ctx, tmp, src, ~maski);
            tcg_gen_rotri_i32(tcg_ctx, tmp, tmp, roti);
            tcg_gen_andi_i32(tcg_ctx, dst, dst, ror32(maski, roti));
            tcg_gen_or_i32(tcg_ctx, dst, dst, tmp);
        }
    } else {
        TCGv mask = tcg_temp_new(tcg_ctx);
        TCGv rot = tcg_temp_new(tcg_ctx);

        if (ext & 0x20) {
            /* Variable width */
            tcg_gen_subi_i32(tcg_ctx, rot, DREG(ext, 0), 1);
            tcg_gen_andi_i32(tcg_ctx, rot, rot, 31);
            tcg_gen_movi_i32(tcg_ctx, mask, -2);
            tcg_gen_shl_i32(tcg_ctx, mask, mask, rot);
            tcg_gen_mov_i32(tcg_ctx, rot, DREG(ext, 0));
            tcg_gen_andc_i32(tcg_ctx, tmp, src, mask);
        } else {
            /* Immediate width (variable offset) */
#ifdef _MSC_VER
            uint32_t maski = 0xfffffffeU << (len - 1);
#else
            uint32_t maski = -2U << (len - 1);
#endif
            tcg_gen_andi_i32(tcg_ctx, tmp, src, ~maski);
            tcg_gen_movi_i32(tcg_ctx, mask, maski);
            tcg_gen_movi_i32(tcg_ctx, rot, len & 31);
        }
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_add_i32(tcg_ctx, rot, rot, DREG(ext, 6));
        } else {
            /* Immediate offset (variable width) */
            tcg_gen_addi_i32(tcg_ctx, rot, rot, ofs);
        }
        tcg_gen_andi_i32(tcg_ctx, rot, rot, 31);
        tcg_gen_rotr_i32(tcg_ctx, mask, mask, rot);
        tcg_gen_rotr_i32(tcg_ctx, tmp, tmp, rot);
        tcg_gen_and_i32(tcg_ctx, dst, dst, mask);
        tcg_gen_or_i32(tcg_ctx, dst, dst, tmp);

        tcg_temp_free(tcg_ctx, rot);
        tcg_temp_free(tcg_ctx, mask);
    }
    tcg_temp_free(tcg_ctx, tmp);
}